

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O2

void util::fs::read_file_to_string(string *filename,string *data)

{
  FileException *this;
  int *piVar1;
  char *msg;
  long local_228;
  ifstream in;
  int aiStack_208 [122];
  
  std::ifstream::ifstream(&local_228,(filename->_M_dataplus)._M_p,_S_bin);
  if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
    std::istream::seekg((long)&local_228,_S_beg);
    std::istream::tellg();
    std::istream::seekg((long)&local_228,_S_beg);
    std::__cxx11::string::resize((ulong)data);
    std::istream::read((char *)&local_228,(long)(data->_M_dataplus)._M_p);
    std::ifstream::close();
    std::ifstream::~ifstream(&local_228);
    return;
  }
  this = (FileException *)__cxa_allocate_exception(0x48);
  piVar1 = __errno_location();
  msg = strerror(*piVar1);
  FileException::FileException(this,filename,msg);
  __cxa_throw(this,&FileException::typeinfo,FileException::~FileException);
}

Assistant:

void
read_file_to_string (std::string const& filename, std::string* data)
{
    std::ifstream in(filename.c_str(), std::ios::binary);
    if (!in.good())
        throw util::FileException(filename, std::strerror(errno));
    in.seekg(0, std::ios::end);
    std::size_t length = in.tellg();
    in.seekg(0, std::ios::beg);
    data->resize(length);
    in.read(&(*data)[0], length);
    in.close();
}